

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTWave_Destroy(FACTWave *pWave)

{
  FACTWaveBank *pFVar1;
  FACTAudioEngine *pFVar2;
  FAudioMutex mutex;
  void **ppvVar3;
  FACTNotification note;
  FACTNotification local_41;
  
  if (pWave != (FACTWave *)0x0) {
    FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
    FACTWave_Stop(pWave,1);
    pFVar1 = pWave->parentBank;
    LinkedList_RemoveEntry(&pFVar1->waveList,pWave,pFVar1->waveLock,pFVar1->parentEngine->pFree);
    FAudioVoice_DestroyVoice(pWave->voice);
    if (pWave->streamCache != (uint8_t *)0x0) {
      (*pWave->parentBank->parentEngine->pFree)(pWave->streamCache);
    }
    if ((pWave->notifyOnDestroy != '\0') ||
       ((pWave->parentBank->parentEngine->notifications & NOTIFY_WAVEDESTROY) != 0)) {
      local_41.type = '\x10';
      pFVar2 = pWave->parentBank->parentEngine;
      ppvVar3 = &pFVar2->wave_context;
      if (-1 < (short)pFVar2->notifications) {
        ppvVar3 = &pWave->usercontext;
      }
      local_41.pvContext = *ppvVar3;
      local_41.field_3.wave.pWave = pWave;
      (*pFVar2->notificationCallback)(&local_41);
    }
    pFVar2 = pWave->parentBank->parentEngine;
    mutex = pFVar2->apiLock;
    (*pFVar2->pFree)(pWave);
    FAudio_PlatformUnlockMutex(mutex);
    return 0;
  }
  return 1;
}

Assistant:

uint32_t FACTWave_Destroy(FACTWave *pWave)
{
	FAudioMutex mutex;
	FACTNotification note;
	if (pWave == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);

	/* Stop before we start deleting everything */
	FACTWave_Stop(pWave, FACT_FLAG_STOP_IMMEDIATE);

	LinkedList_RemoveEntry(
		&pWave->parentBank->waveList,
		pWave,
		pWave->parentBank->waveLock,
		pWave->parentBank->parentEngine->pFree
	);

	FAudioVoice_DestroyVoice(pWave->voice);
	if (pWave->streamCache != NULL)
	{
		pWave->parentBank->parentEngine->pFree(pWave->streamCache);
	}
	if (pWave->notifyOnDestroy || pWave->parentBank->parentEngine->notifications & NOTIFY_WAVEDESTROY)
	{
		note.type = FACTNOTIFICATIONTYPE_WAVEDESTROYED;
		note.wave.pWave = pWave;
		if (pWave->parentBank->parentEngine->notifications & NOTIFY_WAVEDESTROY)
		{
			note.pvContext = pWave->parentBank->parentEngine->wave_context;
		}
		else
		{
			note.pvContext = pWave->usercontext;
		}
		pWave->parentBank->parentEngine->notificationCallback(&note);
	}

	mutex = pWave->parentBank->parentEngine->apiLock;
	pWave->parentBank->parentEngine->pFree(pWave);
	FAudio_PlatformUnlockMutex(mutex);
	return 0;
}